

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

ptr<Object> __thiscall Object::asObject(Object *this)

{
  Object *object;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Object> pVar1;
  
  std::make_shared<Object,Environment&>((Environment *)this);
  object = (Object *)(this->super_Value).super_Member._vptr_Member;
  Environment::setFunctionsOwner(&object->members,object);
  pVar1.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<Object>)pVar1.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Object> Object::asObject() {
    ptr<Object> object = make<Object>(members);
    object -> getEnvironment() -> setFunctionsOwner(object.get());
    return object;
}